

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtConvexConcaveCollisionAlgorithm.cpp
# Opt level: O2

void __thiscall
cbtConvexTriangleCallback::processTriangle
          (cbtConvexTriangleCallback *this,cbtVector3 *triangle,int partId,int triangleIndex)

{
  float fVar1;
  cbtDispatcher *pcVar2;
  cbtManifoldResult *pcVar3;
  _func_int **pp_Var4;
  bool bVar5;
  int iVar6;
  undefined4 extraout_var;
  cbtPersistentManifold *pcVar8;
  cbtCollisionObjectWrapper *pcVar9;
  CProfileSample __profile;
  cbtTriangleShape tm;
  CProfileSample local_d9;
  cbtCollisionObjectWrapper local_d8;
  cbtTriangleShape local_b0;
  long *plVar7;
  
  CProfileSample::CProfileSample(&local_d9,"cbtConvexTriangleCallback::processTriangle");
  bVar5 = TestTriangleAgainstAabb2(triangle,&this->m_aabbMin,&this->m_aabbMax);
  if ((bVar5) && (this->m_convexBodyWrap->m_shape->m_shapeType < 0x18)) {
    pcVar2 = this->m_dispatcher;
    cbtTriangleShape::cbtTriangleShape(&local_b0,triangle,triangle + 1,triangle + 2);
    local_b0.super_cbtPolyhedralConvexShape.super_cbtConvexInternalShape.m_collisionMargin =
         this->m_collisionMarginTriangle;
    local_d8.m_parent = this->m_triBodyWrap;
    local_d8.m_collisionObject = (local_d8.m_parent)->m_collisionObject;
    local_d8.m_worldTransform = (local_d8.m_parent)->m_worldTransform;
    fVar1 = this->m_resultOut->m_closestPointDistanceThreshold;
    if (0.0 < fVar1) {
      pcVar8 = (cbtPersistentManifold *)0x0;
    }
    else {
      pcVar8 = this->m_manifoldPtr;
    }
    local_d8.m_shape = (cbtCollisionShape *)&local_b0;
    local_d8.m_partId = partId;
    local_d8.m_index = triangleIndex;
    iVar6 = (*pcVar2->_vptr_cbtDispatcher[2])
                      (pcVar2,this->m_convexBodyWrap,&local_d8,pcVar8,(ulong)((0.0 < fVar1) + 1));
    plVar7 = (long *)CONCAT44(extraout_var,iVar6);
    pcVar3 = this->m_resultOut;
    pcVar9 = pcVar3->m_body0Wrap;
    if (pcVar9->m_collisionObject == this->m_triBodyWrap->m_collisionObject) {
      pcVar3->m_body0Wrap = &local_d8;
      (*(pcVar3->super_Result)._vptr_Result[2])
                (pcVar3,(ulong)(uint)partId,(ulong)(uint)triangleIndex);
    }
    else {
      pp_Var4 = (pcVar3->super_Result)._vptr_Result;
      pcVar9 = pcVar3->m_body1Wrap;
      pcVar3->m_body1Wrap = &local_d8;
      (*pp_Var4[3])(pcVar3,(ulong)(uint)partId,(ulong)(uint)triangleIndex);
    }
    (**(code **)(*plVar7 + 0x10))
              (plVar7,this->m_convexBodyWrap,&local_d8,this->m_dispatchInfoPtr,this->m_resultOut);
    (&this->m_resultOut->m_body0Wrap)
    [this->m_resultOut->m_body0Wrap->m_collisionObject != this->m_triBodyWrap->m_collisionObject] =
         pcVar9;
    (**(code **)*plVar7)(plVar7);
    (*pcVar2->_vptr_cbtDispatcher[0xf])(pcVar2,plVar7);
    cbtPolyhedralConvexShape::~cbtPolyhedralConvexShape(&local_b0.super_cbtPolyhedralConvexShape);
  }
  CProfileSample::~CProfileSample(&local_d9);
  return;
}

Assistant:

void cbtConvexTriangleCallback::processTriangle(cbtVector3* triangle, int partId, int triangleIndex)
{
	BT_PROFILE("cbtConvexTriangleCallback::processTriangle");

	if (!TestTriangleAgainstAabb2(triangle, m_aabbMin, m_aabbMax))
	{
		return;
	}

	//just for debugging purposes
	//printf("triangle %d",m_triangleCount++);

	cbtCollisionAlgorithmConstructionInfo ci;
	ci.m_dispatcher1 = m_dispatcher;

#if 0	
	
	///debug drawing of the overlapping triangles
	if (m_dispatchInfoPtr && m_dispatchInfoPtr->m_debugDraw && (m_dispatchInfoPtr->m_debugDraw->getDebugMode() &cbtIDebugDraw::DBG_DrawWireframe ))
	{
		const cbtCollisionObject* ob = const_cast<cbtCollisionObject*>(m_triBodyWrap->getCollisionObject());
		cbtVector3 color(1,1,0);
		cbtTransform& tr = ob->getWorldTransform();
		m_dispatchInfoPtr->m_debugDraw->drawLine(tr(triangle[0]),tr(triangle[1]),color);
		m_dispatchInfoPtr->m_debugDraw->drawLine(tr(triangle[1]),tr(triangle[2]),color);
		m_dispatchInfoPtr->m_debugDraw->drawLine(tr(triangle[2]),tr(triangle[0]),color);
	}
#endif

	if (m_convexBodyWrap->getCollisionShape()->isConvex())
	{
		cbtTriangleShape tm(triangle[0], triangle[1], triangle[2]);
		tm.setMargin(m_collisionMarginTriangle);

		cbtCollisionObjectWrapper triObWrap(m_triBodyWrap, &tm, m_triBodyWrap->getCollisionObject(), m_triBodyWrap->getWorldTransform(), partId, triangleIndex);  //correct transform?
		cbtCollisionAlgorithm* colAlgo = 0;

		if (m_resultOut->m_closestPointDistanceThreshold > 0)
		{
			colAlgo = ci.m_dispatcher1->findAlgorithm(m_convexBodyWrap, &triObWrap, 0, BT_CLOSEST_POINT_ALGORITHMS);
		}
		else
		{
			colAlgo = ci.m_dispatcher1->findAlgorithm(m_convexBodyWrap, &triObWrap, m_manifoldPtr, BT_CONTACT_POINT_ALGORITHMS);
		}
		const cbtCollisionObjectWrapper* tmpWrap = 0;

		if (m_resultOut->getBody0Internal() == m_triBodyWrap->getCollisionObject())
		{
			tmpWrap = m_resultOut->getBody0Wrap();
			m_resultOut->setBody0Wrap(&triObWrap);
			m_resultOut->setShapeIdentifiersA(partId, triangleIndex);
		}
		else
		{
			tmpWrap = m_resultOut->getBody1Wrap();
			m_resultOut->setBody1Wrap(&triObWrap);
			m_resultOut->setShapeIdentifiersB(partId, triangleIndex);
		}

		colAlgo->processCollision(m_convexBodyWrap, &triObWrap, *m_dispatchInfoPtr, m_resultOut);

		if (m_resultOut->getBody0Internal() == m_triBodyWrap->getCollisionObject())
		{
			m_resultOut->setBody0Wrap(tmpWrap);
		}
		else
		{
			m_resultOut->setBody1Wrap(tmpWrap);
		}

		colAlgo->~cbtCollisionAlgorithm();
		ci.m_dispatcher1->freeCollisionAlgorithm(colAlgo);
	}
}